

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QPointF __thiscall QGraphicsItem::mapToParent(QGraphicsItem *this,QPointF *point)

{
  QGraphicsItemPrivate *this_00;
  long lVar1;
  undefined8 *puVar2;
  QTransform *pQVar3;
  long in_FS_OFFSET;
  double dVar4;
  double in_XMM1_Qa;
  QPointF QVar5;
  QTransform matrix;
  QTransform QStack_68;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  if (this_00->transformData == (TransformData *)0x0) {
    dVar4 = (this_00->pos).xp + point->xp;
    in_XMM1_Qa = (this_00->pos).yp + point->yp;
  }
  else {
    puVar2 = &DAT_00700eb8;
    pQVar3 = &QStack_68;
    for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pQVar3 = *puVar2;
      puVar2 = puVar2 + 1;
      pQVar3 = (QTransform *)((long)pQVar3 + 8);
    }
    puVar2 = &DAT_00700e28;
    pQVar3 = &QStack_68;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pQVar3 = *puVar2;
      puVar2 = puVar2 + 1;
      pQVar3 = (QTransform *)((long)pQVar3 + 8);
    }
    QStack_68._72_2_ = QStack_68._72_2_ & 0xfc00;
    QGraphicsItemPrivate::combineTransformToParent(this_00,&QStack_68,(QTransform *)0x0);
    dVar4 = (double)QTransform::map((QPointF *)&QStack_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar5.yp = in_XMM1_Qa;
    QVar5.xp = dVar4;
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QPointF QGraphicsItem::mapToParent(const QPointF &point) const
{
    // COMBINE
    if (!d_ptr->transformData)
        return point + d_ptr->pos;
    return d_ptr->transformToParent().map(point);
}